

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

string * __thiscall
ast::Dir_space::more_listing_abi_cxx11_(string *__return_storage_ptr__,Dir_space *this)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  string local_90;
  string local_70;
  string local_40;
  uint local_20;
  undefined1 local_19;
  uint i;
  Dir_space *this_local;
  string *tmp;
  
  local_19 = 0;
  _i = this;
  this_local = (Dir_space *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((this->super_Directive).super_Statement.size_in_memory < 4) {
    for (local_20 = 1; local_20 < (this->super_Directive).super_Statement.size_in_memory;
        local_20 = local_20 + 1) {
      uVar1 = (this->super_Directive).super_Statement.location.line;
      uVar3 = Sections::get_address((this->super_Directive).super_Statement.section_index);
      uVar5 = (this->super_Directive).super_Statement.section_offset + local_20;
      bVar2 = Sections::read8((this->super_Directive).super_Statement.section_index,uVar5);
      string_printf_abi_cxx11_
                (&local_40,"%4d %04X %02X\n",(ulong)uVar1,(ulong)(uVar5 + uVar3),(ulong)bVar2);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    string_printf_abi_cxx11_
              (&local_70,"%4d .... ..\n",
               (ulong)(uint)(this->super_Directive).super_Statement.location.line);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    uVar1 = (this->super_Directive).super_Statement.location.line;
    uVar4 = Sections::get_address((this->super_Directive).super_Statement.section_index);
    uVar3 = (this->super_Directive).super_Statement.section_offset;
    uVar5 = (this->super_Directive).super_Statement.size_in_memory;
    bVar2 = Sections::read8((this->super_Directive).super_Statement.section_index,
                            (uVar3 - 1) + uVar5);
    string_printf_abi_cxx11_
              (&local_90,"%4d %04X %02X\n",(ulong)uVar1,(ulong)((uVar4 - 1) + uVar3 + uVar5),
               (ulong)bVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

string Dir_space::more_listing()
{
	string tmp = {};
	if (size_in_memory <= 3)
		for (unsigned i = 1; i < size_in_memory; ++i) {
			tmp += string_printf("%4d %04X %02X\n", location.line,
				Sections::get_address(section_index) + section_offset + i,
				Sections::read8(section_index, section_offset + i));
		}
	else {
		tmp += string_printf("%4d .... ..\n", location.line);
		tmp += string_printf("%4d %04X %02X\n", location.line,
			Sections::get_address(section_index) + section_offset + size_in_memory - 1,
			Sections::read8(section_index, section_offset + size_in_memory - 1));
	}
	return tmp;
}